

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_method_diffie_hellman_group_exchange_sha256_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar **ppuVar1;
  libssh2_nonblocking_states lVar2;
  BIGNUM *a;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  EVP_MD_CTX *ctx;
  int iVar6;
  uint uVar7;
  uint len;
  int iVar8;
  BIGNUM *pBVar9;
  BN_CTX *pBVar10;
  BIGNUM *pBVar11;
  uchar *puVar12;
  uchar *puVar13;
  LIBSSH2_CRYPT_METHOD *pLVar14;
  _LIBSSH2_MAC_METHOD *p_Var15;
  LIBSSH2_COMP_METHOD *pLVar16;
  size_t sVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  uchar *puVar21;
  EVP_MD_CTX *ctx_00;
  void **ppvVar22;
  size_t sVar23;
  EVP_MD_CTX *fingerprint_ctx;
  EVP_MD_CTX *exchange_hash_ctx;
  int free_iv;
  int free_secret;
  void **local_40;
  size_t local_38;
  
  iVar6 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    pBVar9 = BN_new();
    key_state->p = (BIGNUM *)pBVar9;
    pBVar9 = BN_new();
    key_state->g = (BIGNUM *)pBVar9;
    key_state->request[0] = '\"';
    _libssh2_htonu32(key_state->request + 1,0x400);
    _libssh2_htonu32(key_state->request + 5,0x600);
    _libssh2_htonu32(key_state->request + 9,0x800);
    key_state->request_len = 0xd;
    key_state->state = libssh2_NB_state_created;
    sVar17 = 0xd;
    break;
  default:
    goto switchD_0011ff62_caseD_1;
  case libssh2_NB_state_created:
    sVar17 = key_state->request_len;
    break;
  case libssh2_NB_state_sent:
    goto switchD_0011ff62_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_0011ff62_caseD_4;
  }
  iVar6 = _libssh2_transport_send(session,key_state->request,sVar17,(uchar *)0x0,0);
  if (iVar6 == -0x25) {
    return -0x25;
  }
  if (iVar6 != 0) {
    pcVar18 = "Unable to send Group Exchange Request SHA256";
LAB_00120412:
    iVar6 = _libssh2_error(session,iVar6,pcVar18);
    goto switchD_0011ff62_caseD_1;
  }
  key_state->state = libssh2_NB_state_sent;
switchD_0011ff62_caseD_3:
  iVar6 = _libssh2_packet_require
                    (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                     &key_state->req_state);
  if (iVar6 == -0x25) {
    return -0x25;
  }
  if (iVar6 != 0) {
    pcVar18 = "Timeout waiting for GEX_GROUP reply SHA256";
    goto LAB_00120412;
  }
  key_state->state = libssh2_NB_state_sent1;
switchD_0011ff62_caseD_4:
  puVar12 = key_state->data;
  uVar7 = _libssh2_ntohu32(puVar12 + 1);
  BN_bin2bn(puVar12 + 5,uVar7,(BIGNUM *)key_state->p);
  len = _libssh2_ntohu32(puVar12 + (ulong)uVar7 + 5);
  BN_bin2bn(puVar12 + (ulong)uVar7 + 9,len,(BIGNUM *)key_state->g);
  lVar2 = (key_state->exchange_state).state;
  iVar6 = 0;
  if (libssh2_NB_state_sent3 < lVar2) goto switchD_001200c8_caseD_1;
  pBVar9 = (BIGNUM *)key_state->p;
  ppvVar22 = (void **)key_state->data;
  local_38 = key_state->data_len;
  switch(lVar2) {
  case libssh2_NB_state_idle:
    a = (BIGNUM *)key_state->g;
    ppuVar1 = &(key_state->exchange_state).e_packet;
    (key_state->exchange_state).k_value = (uchar *)0x0;
    (key_state->exchange_state).e_packet = (uchar *)0x0;
    (key_state->exchange_state).s_packet = (uchar *)0x0;
    local_40 = ppvVar22;
    pBVar10 = BN_CTX_new();
    (key_state->exchange_state).ctx = (BN_CTX *)pBVar10;
    pBVar11 = BN_new();
    (key_state->exchange_state).x = (BIGNUM *)pBVar11;
    pBVar11 = BN_new();
    (key_state->exchange_state).e = (BIGNUM *)pBVar11;
    pBVar11 = BN_new();
    (key_state->exchange_state).f = (BIGNUM *)pBVar11;
    pBVar11 = BN_new();
    (key_state->exchange_state).k = (BIGNUM *)pBVar11;
    *(undefined8 *)&(key_state->exchange_state).req_state = 0;
    (key_state->exchange_state).req_state.start = 0;
    BN_rand((BIGNUM *)(key_state->exchange_state).x,uVar7 * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)(key_state->exchange_state).e,a,(BIGNUM *)(key_state->exchange_state).x,
               pBVar9,(BN_CTX *)(key_state->exchange_state).ctx);
    iVar8 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
    iVar6 = iVar8 + 0xe;
    if (-1 < iVar8 + 7) {
      iVar6 = iVar8 + 7;
    }
    (key_state->exchange_state).e_packet_len = (long)((iVar6 >> 3) + 6);
    uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
    sVar17 = (key_state->exchange_state).e_packet_len;
    if ((uVar7 & 7) != 0) {
      sVar17 = sVar17 - 1;
      (key_state->exchange_state).e_packet_len = sVar17;
    }
    puVar12 = (uchar *)(*session->alloc)(sVar17,&session->abstract);
    *ppuVar1 = puVar12;
    if (puVar12 != (uchar *)0x0) {
      *puVar12 = ' ';
      _libssh2_htonu32((key_state->exchange_state).e_packet + 1,
                       (int)(key_state->exchange_state).e_packet_len - 5);
      uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
      lVar20 = 5;
      if ((uVar7 & 7) == 0) {
        (*ppuVar1)[5] = '\0';
        lVar20 = 6;
      }
      BN_bn2bin((BIGNUM *)(key_state->exchange_state).e,
                (key_state->exchange_state).e_packet + lVar20);
      (key_state->exchange_state).state = libssh2_NB_state_created;
      ppvVar22 = local_40;
      goto switchD_001200c8_caseD_2;
    }
    pcVar18 = "Out of memory error";
    goto LAB_00120da8;
  case libssh2_NB_state_allocated:
    goto switchD_001200c8_caseD_1;
  case libssh2_NB_state_created:
switchD_001200c8_caseD_2:
    iVar6 = _libssh2_transport_send
                      (session,(key_state->exchange_state).e_packet,
                       (key_state->exchange_state).e_packet_len,(uchar *)0x0,0);
    if (iVar6 == -0x25) {
      return -0x25;
    }
    if (iVar6 == 0) {
      (key_state->exchange_state).state = libssh2_NB_state_sent;
      goto switchD_001200c8_caseD_3;
    }
    pcVar18 = "Unable to send KEX init message";
    goto LAB_00120db0;
  case libssh2_NB_state_sent:
switchD_001200c8_caseD_3:
    if ((session->field_0x80 & 1) != 0) {
      iVar6 = _libssh2_packet_burn(session,&(key_state->exchange_state).burn_state);
      if (iVar6 == -0x25) {
        return -0x25;
      }
      if (iVar6 < 1) goto switchD_001200c8_caseD_1;
      session->field_0x80 = session->field_0x80 & 0xfe;
    }
    (key_state->exchange_state).state = libssh2_NB_state_sent1;
    break;
  case libssh2_NB_state_sent2:
    goto switchD_001200c8_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_001200c8_caseD_6;
  }
  iVar6 = _libssh2_packet_require
                    (session,'!',&(key_state->exchange_state).s_packet,
                     &(key_state->exchange_state).s_packet_len,0,(uchar *)0x0,0,
                     &(key_state->exchange_state).req_state);
  if (iVar6 == -0x25) {
    return -0x25;
  }
  if (iVar6 == 0) {
    puVar12 = (key_state->exchange_state).s_packet + 1;
    (key_state->exchange_state).s = puVar12;
    uVar7 = _libssh2_ntohu32(puVar12);
    session->server_hostkey_len = uVar7;
    ppuVar1 = &(key_state->exchange_state).s;
    *ppuVar1 = *ppuVar1 + 4;
    if (session->server_hostkey != (uchar *)0x0) {
      (*session->free)(session->server_hostkey,&session->abstract);
      uVar7 = session->server_hostkey_len;
    }
    puVar12 = (uchar *)(*session->alloc)((ulong)uVar7,&session->abstract);
    session->server_hostkey = puVar12;
    if (puVar12 == (uchar *)0x0) {
      pcVar18 = "Unable to allocate memory for a copy of the host key";
LAB_00120da8:
      iVar6 = -6;
      goto LAB_00120db0;
    }
    memcpy(puVar12,(key_state->exchange_state).s,(ulong)session->server_hostkey_len);
    ppuVar1 = &(key_state->exchange_state).s;
    *ppuVar1 = *ppuVar1 + session->server_hostkey_len;
    iVar6 = _libssh2_md5_init(&fingerprint_ctx);
    if (iVar6 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_md5,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_md5_valid = (uint)(iVar6 != 0);
    iVar6 = _libssh2_sha1_init(&fingerprint_ctx);
    if (iVar6 != 0) {
      EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey,
                       (ulong)session->server_hostkey_len);
      EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,session->server_hostkey_sha1,(uint *)0x0);
      EVP_MD_CTX_free(fingerprint_ctx);
    }
    session->server_hostkey_sha1_valid = (uint)(iVar6 != 0);
    iVar6 = (*session->hostkey->init)
                      (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                       &session->server_hostkey_abstract);
    if (iVar6 != 0) {
      pcVar18 = "Unable to initialize hostkey importer";
      iVar6 = -10;
      goto LAB_00120db0;
    }
    uVar7 = _libssh2_ntohu32((key_state->exchange_state).s);
    (key_state->exchange_state).f_value_len = (ulong)uVar7;
    puVar13 = (key_state->exchange_state).s;
    puVar12 = puVar13 + 4;
    (key_state->exchange_state).f_value = puVar12;
    (key_state->exchange_state).s = puVar13 + (ulong)uVar7 + 4;
    BN_bin2bn(puVar12,uVar7,(BIGNUM *)(key_state->exchange_state).f);
    uVar7 = _libssh2_ntohu32((key_state->exchange_state).s);
    (key_state->exchange_state).h_sig_len = (ulong)uVar7;
    puVar12 = (key_state->exchange_state).s + 4;
    (key_state->exchange_state).s = puVar12;
    (key_state->exchange_state).h_sig = puVar12;
    BN_mod_exp((BIGNUM *)(key_state->exchange_state).k,(BIGNUM *)(key_state->exchange_state).f,
               (BIGNUM *)(key_state->exchange_state).x,pBVar9,
               (BN_CTX *)(key_state->exchange_state).ctx);
    iVar8 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
    iVar6 = iVar8 + 0xe;
    if (-1 < iVar8 + 7) {
      iVar6 = iVar8 + 7;
    }
    (key_state->exchange_state).k_value_len = (long)((iVar6 >> 3) + 5);
    uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
    sVar17 = (key_state->exchange_state).k_value_len;
    if ((uVar7 & 7) != 0) {
      sVar17 = sVar17 - 1;
      (key_state->exchange_state).k_value_len = sVar17;
    }
    puVar12 = (uchar *)(*session->alloc)(sVar17,&session->abstract);
    (key_state->exchange_state).k_value = puVar12;
    if (puVar12 == (uchar *)0x0) {
      pcVar18 = "Unable to allocate buffer for K";
      goto LAB_00120da8;
    }
    _libssh2_htonu32(puVar12,(int)(key_state->exchange_state).k_value_len - 4);
    uVar7 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
    lVar20 = 4;
    if ((uVar7 & 7) == 0) {
      (key_state->exchange_state).k_value[4] = '\0';
      lVar20 = 5;
    }
    local_38 = local_38 - 1;
    local_40 = &session->server_hostkey_abstract;
    BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,(key_state->exchange_state).k_value + lVar20);
    (key_state->exchange_state).exchange_hash = &exchange_hash_ctx;
    _libssh2_sha256_init(&exchange_hash_ctx);
    puVar13 = (session->local).banner;
    puVar12 = (key_state->exchange_state).h_sig_comp;
    if (puVar13 == (uchar *)0x0) {
      _libssh2_htonu32(puVar12,0x15);
      EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
      pcVar18 = "SSH-2.0-libssh2_1.8.0";
      sVar23 = 0x15;
      ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
    }
    else {
      sVar23 = strlen((char *)puVar13);
      _libssh2_htonu32(puVar12,(int)sVar23 - 2);
      EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
      ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
      pcVar18 = (char *)(session->local).banner;
      sVar23 = strlen(pcVar18);
      sVar23 = sVar23 - 2;
    }
    EVP_DigestUpdate(ctx_00,pcVar18,sVar23);
    sVar23 = strlen((char *)(session->remote).banner);
    _libssh2_htonu32(puVar12,(uint32_t)sVar23);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
    ctx = exchange_hash_ctx;
    puVar13 = (session->remote).banner;
    sVar23 = strlen((char *)puVar13);
    EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar13,sVar23);
    _libssh2_htonu32(puVar12,(uint32_t)(session->local).kexinit_len);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->local).kexinit,
                     (session->local).kexinit_len);
    _libssh2_htonu32(puVar12,(uint32_t)(session->remote).kexinit_len);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->remote).kexinit,
                     (session->remote).kexinit_len);
    _libssh2_htonu32(puVar12,session->server_hostkey_len);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                     (ulong)session->server_hostkey_len);
    _libssh2_htonu32(puVar12,0x400);
    _libssh2_htonu32((key_state->exchange_state).h_sig_comp + 4,0x600);
    _libssh2_htonu32((key_state->exchange_state).h_sig_comp + 8,0x800);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,0xc);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(uchar *)((long)ppvVar22 + 1),local_38);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(key_state->exchange_state).e_packet + 1,
                     (key_state->exchange_state).e_packet_len - 1);
    _libssh2_htonu32(puVar12,(uint32_t)(key_state->exchange_state).f_value_len);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar12,4);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(key_state->exchange_state).f_value,
                     (key_state->exchange_state).f_value_len);
    EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(key_state->exchange_state).k_value,
                     (key_state->exchange_state).k_value_len);
    EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,puVar12,(uint *)0x0);
    EVP_MD_CTX_free(exchange_hash_ctx);
    iVar6 = (*session->hostkey->sig_verify)
                      (session,(key_state->exchange_state).h_sig,
                       (key_state->exchange_state).h_sig_len,puVar12,0x20,local_40);
    if (iVar6 != 0) {
      pcVar18 = "Unable to verify hostkey signature";
      iVar6 = -0xb;
      goto LAB_00120db0;
    }
    (key_state->exchange_state).c = '\x15';
    (key_state->exchange_state).state = libssh2_NB_state_sent2;
switchD_001200c8_caseD_5:
    iVar6 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
    if (iVar6 == -0x25) {
      return -0x25;
    }
    if (iVar6 != 0) {
      pcVar18 = "Unable to send NEWKEYS message";
      goto LAB_00120db0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_sent3;
switchD_001200c8_caseD_6:
    ppuVar1 = &(key_state->exchange_state).tmp;
    iVar6 = _libssh2_packet_require
                      (session,'\x15',ppuVar1,&(key_state->exchange_state).tmp_len,0,(uchar *)0x0,0,
                       &(key_state->exchange_state).req_state);
    if (iVar6 == -0x25) {
      return -0x25;
    }
    if (iVar6 != 0) {
      pcVar18 = "Timed out waiting for NEWKEYS";
      goto LAB_00120db0;
    }
    *(byte *)&session->state = (byte)session->state | 2;
    (*session->free)(*ppuVar1,&session->abstract);
    if (session->session_id == (uchar *)0x0) {
      puVar12 = (uchar *)(*session->alloc)(0x20,&session->abstract);
      session->session_id = puVar12;
      if (puVar12 == (uchar *)0x0) {
        pcVar18 = "Unable to allocate buffer for SHA digest";
        goto LAB_00120da8;
      }
      uVar3 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
      uVar4 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
      uVar5 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
      *(undefined8 *)(puVar12 + 0x10) =
           *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
      *(undefined8 *)(puVar12 + 0x18) = uVar5;
      *(undefined8 *)puVar12 = uVar3;
      *(undefined8 *)(puVar12 + 8) = uVar4;
      session->session_id_len = 0x20;
    }
    pLVar14 = (session->local).crypt;
    if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*pLVar14->dtor)(session,&(session->local).crypt_abstract);
      pLVar14 = (session->local).crypt;
    }
    if (pLVar14->init !=
        (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
         *)0x0) {
      free_iv = 0;
      free_secret = 0;
      puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract);
      if (puVar12 == (uchar *)0x0) {
        iVar6 = -1;
        goto switchD_001200c8_caseD_1;
      }
      pLVar14 = (session->local).crypt;
      if (pLVar14->iv_len != 0) {
        sVar23 = 0;
        do {
          _libssh2_sha256_init(&fingerprint_ctx);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,0x20
                          );
          uVar19 = sVar23;
          puVar13 = puVar12;
          if (sVar23 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"A",1);
            uVar19 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar13,uVar19);
          EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar12 + sVar23,(uint *)0x0);
          EVP_MD_CTX_free(fingerprint_ctx);
          sVar23 = sVar23 + 0x20;
          pLVar14 = (session->local).crypt;
        } while (sVar23 < (ulong)(long)pLVar14->iv_len);
      }
      puVar13 = (uchar *)(*session->alloc)((long)pLVar14->secret_len + 0x20,&session->abstract);
      if (puVar13 != (uchar *)0x0) {
        pLVar14 = (session->local).crypt;
        if (pLVar14->secret_len != 0) {
          sVar23 = 0;
          do {
            _libssh2_sha256_init(&fingerprint_ctx);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                             (key_state->exchange_state).k_value_len);
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,
                             0x20);
            uVar19 = sVar23;
            puVar21 = puVar13;
            if (sVar23 == 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"C",1);
              uVar19 = (ulong)session->session_id_len;
              puVar21 = session->session_id;
            }
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar21,uVar19);
            EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar13 + sVar23,(uint *)0x0);
            EVP_MD_CTX_free(fingerprint_ctx);
            sVar23 = sVar23 + 0x20;
            pLVar14 = (session->local).crypt;
          } while (sVar23 < (ulong)(long)pLVar14->secret_len);
        }
        iVar6 = (*pLVar14->init)(session,pLVar14,puVar12,&free_iv,puVar13,&free_secret,1,
                                 &(session->local).crypt_abstract);
        puVar21 = puVar12;
        if (iVar6 == 0) {
          if (free_iv != 0) {
            memset(puVar12,0,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar12,&session->abstract);
          }
          if (free_secret != 0) {
            memset(puVar13,0,(long)((session->local).crypt)->secret_len);
            (*session->free)(puVar13,&session->abstract);
          }
          goto LAB_00120b59;
        }
LAB_00120d57:
        puVar12 = puVar13;
        (*session->free)(puVar21,&session->abstract);
      }
LAB_00120d92:
      (*session->free)(puVar12,&session->abstract);
LAB_00120d99:
      iVar6 = -5;
      goto switchD_001200c8_caseD_1;
    }
LAB_00120b59:
    pLVar14 = (session->remote).crypt;
    if (pLVar14->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*pLVar14->dtor)(session,&(session->remote).crypt_abstract);
      pLVar14 = (session->remote).crypt;
    }
    if (pLVar14->init !=
        (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
         *)0x0) {
      free_iv = 0;
      free_secret = 0;
      puVar12 = (uchar *)(*session->alloc)((long)pLVar14->iv_len + 0x20,&session->abstract);
      if (puVar12 == (uchar *)0x0) goto LAB_00120d99;
      pLVar14 = (session->remote).crypt;
      if (pLVar14->iv_len != 0) {
        sVar23 = 0;
        do {
          _libssh2_sha256_init(&fingerprint_ctx);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,0x20
                          );
          uVar19 = sVar23;
          puVar13 = puVar12;
          if (sVar23 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"B",1);
            uVar19 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar13,uVar19);
          EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar12 + sVar23,(uint *)0x0);
          EVP_MD_CTX_free(fingerprint_ctx);
          sVar23 = sVar23 + 0x20;
          pLVar14 = (session->remote).crypt;
        } while (sVar23 < (ulong)(long)pLVar14->iv_len);
      }
      puVar13 = (uchar *)(*session->alloc)((long)pLVar14->secret_len + 0x20,&session->abstract);
      if (puVar13 == (uchar *)0x0) goto LAB_00120d92;
      pLVar14 = (session->remote).crypt;
      if (pLVar14->secret_len != 0) {
        sVar23 = 0;
        do {
          _libssh2_sha256_init(&fingerprint_ctx);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,0x20
                          );
          uVar19 = sVar23;
          puVar21 = puVar13;
          if (sVar23 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"D",1);
            uVar19 = (ulong)session->session_id_len;
            puVar21 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar21,uVar19);
          EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar13 + sVar23,(uint *)0x0);
          EVP_MD_CTX_free(fingerprint_ctx);
          sVar23 = sVar23 + 0x20;
          pLVar14 = (session->remote).crypt;
        } while (sVar23 < (ulong)(long)pLVar14->secret_len);
      }
      iVar6 = (*pLVar14->init)(session,pLVar14,puVar12,&free_iv,puVar13,&free_secret,0,
                               &(session->remote).crypt_abstract);
      puVar21 = puVar12;
      if (iVar6 != 0) goto LAB_00120d57;
      if (free_iv != 0) {
        memset(puVar12,0,(long)((session->remote).crypt)->iv_len);
        (*session->free)(puVar12,&session->abstract);
      }
      if (free_secret != 0) {
        memset(puVar13,0,(long)((session->remote).crypt)->secret_len);
        (*session->free)(puVar13,&session->abstract);
      }
    }
    p_Var15 = (session->local).mac;
    if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*p_Var15->dtor)(session,&(session->local).mac_abstract);
      p_Var15 = (session->local).mac;
    }
    if (p_Var15->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
      free_iv = 0;
      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,&session->abstract);
      if (puVar12 == (uchar *)0x0) goto LAB_00120d99;
      p_Var15 = (session->local).mac;
      if (p_Var15->key_len != 0) {
        sVar23 = 0;
        do {
          _libssh2_sha256_init(&fingerprint_ctx);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,0x20
                          );
          uVar19 = sVar23;
          puVar13 = puVar12;
          if (sVar23 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"E",1);
            uVar19 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar13,uVar19);
          EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar12 + sVar23,(uint *)0x0);
          EVP_MD_CTX_free(fingerprint_ctx);
          sVar23 = sVar23 + 0x20;
          p_Var15 = (session->local).mac;
        } while (sVar23 < (ulong)(long)p_Var15->key_len);
      }
      (*p_Var15->init)(session,puVar12,&free_iv,&(session->local).mac_abstract);
      if (free_iv != 0) {
        memset(puVar12,0,(long)((session->local).mac)->key_len);
        (*session->free)(puVar12,&session->abstract);
      }
    }
    p_Var15 = (session->remote).mac;
    if (p_Var15->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*p_Var15->dtor)(session,&(session->remote).mac_abstract);
      p_Var15 = (session->remote).mac;
    }
    if (p_Var15->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
      free_iv = 0;
      puVar12 = (uchar *)(*session->alloc)((long)p_Var15->key_len + 0x20,&session->abstract);
      if (puVar12 == (uchar *)0x0) goto LAB_00120d99;
      p_Var15 = (session->remote).mac;
      if (p_Var15->key_len != 0) {
        sVar23 = 0;
        do {
          _libssh2_sha256_init(&fingerprint_ctx);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).k_value,
                           (key_state->exchange_state).k_value_len);
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,(key_state->exchange_state).h_sig_comp,0x20
                          );
          uVar19 = sVar23;
          puVar13 = puVar12;
          if (sVar23 == 0) {
            EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,"F",1);
            uVar19 = (ulong)session->session_id_len;
            puVar13 = session->session_id;
          }
          EVP_DigestUpdate((EVP_MD_CTX *)fingerprint_ctx,puVar13,uVar19);
          EVP_DigestFinal((EVP_MD_CTX *)fingerprint_ctx,puVar12 + sVar23,(uint *)0x0);
          EVP_MD_CTX_free(fingerprint_ctx);
          sVar23 = sVar23 + 0x20;
          p_Var15 = (session->remote).mac;
        } while (sVar23 < (ulong)(long)p_Var15->key_len);
      }
      (*p_Var15->init)(session,puVar12,&free_iv,&(session->remote).mac_abstract);
      if (free_iv != 0) {
        memset(puVar12,0,(long)((session->remote).mac)->key_len);
        (*session->free)(puVar12,&session->abstract);
      }
    }
    pLVar16 = (session->local).comp;
    if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
      if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
        (*pLVar16->dtor)(session,1,&(session->local).comp_abstract);
        pLVar16 = (session->local).comp;
        if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_001211ef;
      }
      if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
        iVar8 = (*pLVar16->init)(session,1,&(session->local).comp_abstract);
        iVar6 = -5;
        if (iVar8 != 0) goto switchD_001200c8_caseD_1;
      }
    }
LAB_001211ef:
    pLVar16 = (session->remote).comp;
    iVar6 = 0;
    if (pLVar16 != (LIBSSH2_COMP_METHOD *)0x0) {
      if (pLVar16->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
        iVar6 = 0;
        (*pLVar16->dtor)(session,0,&(session->remote).comp_abstract);
        pLVar16 = (session->remote).comp;
        if (pLVar16 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_001200c8_caseD_1;
      }
      iVar6 = 0;
      if (pLVar16->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
        iVar6 = (*pLVar16->init)(session,0,&(session->remote).comp_abstract);
        iVar6 = (uint)(iVar6 == 0) * 5 + -5;
      }
    }
  }
  else {
    pcVar18 = "Timed out waiting for KEX reply";
    iVar6 = -9;
LAB_00120db0:
    iVar6 = _libssh2_error(session,iVar6,pcVar18);
  }
switchD_001200c8_caseD_1:
  BN_clear_free((BIGNUM *)(key_state->exchange_state).x);
  (key_state->exchange_state).x = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)(key_state->exchange_state).e);
  (key_state->exchange_state).e = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)(key_state->exchange_state).f);
  (key_state->exchange_state).f = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
  (key_state->exchange_state).k = (BIGNUM *)0x0;
  BN_CTX_free((BN_CTX *)(key_state->exchange_state).ctx);
  (key_state->exchange_state).ctx = (BN_CTX *)0x0;
  puVar12 = (key_state->exchange_state).e_packet;
  if (puVar12 != (uchar *)0x0) {
    (*session->free)(puVar12,&session->abstract);
    (key_state->exchange_state).e_packet = (uchar *)0x0;
  }
  puVar12 = (key_state->exchange_state).s_packet;
  if (puVar12 != (uchar *)0x0) {
    (*session->free)(puVar12,&session->abstract);
    (key_state->exchange_state).s_packet = (uchar *)0x0;
  }
  puVar12 = (key_state->exchange_state).k_value;
  if (puVar12 != (uchar *)0x0) {
    (*session->free)(puVar12,&session->abstract);
    (key_state->exchange_state).k_value = (uchar *)0x0;
  }
  (key_state->exchange_state).state = libssh2_NB_state_idle;
  if (iVar6 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
switchD_0011ff62_caseD_1:
  key_state->state = libssh2_NB_state_idle;
  BN_clear_free((BIGNUM *)key_state->g);
  key_state->g = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)key_state->p);
  key_state->p = (BIGNUM *)0x0;
  return iVar6;
}

Assistant:

static int
kex_method_diffie_hellman_group_exchange_sha256_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    unsigned long p_len, g_len;
    int ret = 0;
    int rc;

    if (key_state->state == libssh2_NB_state_idle) {
        key_state->p = _libssh2_bn_init();
        key_state->g = _libssh2_bn_init();
        /* Ask for a P and G pair */
#ifdef LIBSSH2_DH_GEX_NEW
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_MINGROUP);
        _libssh2_htonu32(key_state->request + 5, LIBSSH2_DH_GEX_OPTGROUP);
        _libssh2_htonu32(key_state->request + 9, LIBSSH2_DH_GEX_MAXGROUP);
        key_state->request_len = 13;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange (New Method SHA256)");
#else
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST_OLD;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_OPTGROUP);
        key_state->request_len = 5;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange (Old Method SHA256)");
#endif

        key_state->state = libssh2_NB_state_created;
    }

    if (key_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send Group Exchange Request SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent;
    }

    if (key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_require(session, SSH_MSG_KEX_DH_GEX_GROUP,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for GEX_GROUP reply SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if (key_state->state == libssh2_NB_state_sent1) {
        unsigned char *s = key_state->data + 1;
        p_len = _libssh2_ntohu32(s);
        s += 4;
        _libssh2_bn_from_bin(key_state->p, p_len, s);
        s += p_len;

        g_len = _libssh2_ntohu32(s);
        s += 4;
        _libssh2_bn_from_bin(key_state->g, g_len, s);

        ret = diffie_hellman_sha256(session, key_state->g, key_state->p, p_len,
                                    SSH_MSG_KEX_DH_GEX_INIT,
                                    SSH_MSG_KEX_DH_GEX_REPLY,
                                    key_state->data + 1,
                                    key_state->data_len - 1,
                                    &key_state->exchange_state);
        if (ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

  dh_gex_clean_exit:
    key_state->state = libssh2_NB_state_idle;
    _libssh2_bn_free(key_state->g);
    key_state->g = NULL;
    _libssh2_bn_free(key_state->p);
    key_state->p = NULL;

    return ret;
}